

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  ActivationLinear *pAVar6;
  ulong uVar7;
  bool bVar8;
  LogMessage *other;
  long *plVar9;
  size_type *psVar10;
  undefined1 *puVar11;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_0033deca;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Slice","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_e8,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c8);
  }
  iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  );
  pcVar4 = local_c8 + 0x10;
  local_c8._8_8_ = (char *)0x0;
  local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
  if (layer->_oneof_case_[0] == 0x15e) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_SliceLayerParams_default_instance_;
  }
  iVar3 = (((ConvolutionLayerParams *)puVar11)->stride_).current_size_;
  local_c8._0_8_ = pcVar4;
  if (iVar3 == 0) {
    bVar8 = true;
    if (iVar2 < 3) {
LAB_0033dd5b:
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      lVar5 = *plVar9;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,lVar5,plVar9[1] + lVar5);
      std::operator+(&local_70,"Slice layer \'",&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
LAB_0033ddf5:
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_e8.field_2._M_allocated_capacity = *psVar10;
        local_e8.field_2._8_8_ = plVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar10;
        local_e8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_e8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
      bVar8 = false;
    }
  }
  else if (iVar3 == 1) {
    bVar8 = true;
    if (iVar2 < 2) goto LAB_0033dd5b;
  }
  else {
    if (iVar3 != 2) {
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      lVar5 = *plVar9;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,lVar5,plVar9[1] + lVar5);
      std::operator+(&local_70,"Slice layer: \'",&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      goto LAB_0033ddf5;
    }
    bVar8 = true;
    if (iVar2 < 1) goto LAB_0033dd5b;
  }
  if ((pointer)local_c8._0_8_ != pcVar4) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
LAB_0033deca:
  if (layer->_oneof_case_[0] == 0x15e) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_SliceLayerParams_default_instance_;
  }
  if ((((SliceDynamicLayerParams *)puVar11)->endids_).current_size_ < 1) {
    std::operator+(&local_e8,"Stride length for the slice layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_c8._0_8_ = local_c8 + 0x10;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar10) {
      local_c8._16_8_ = *psVar10;
      local_c8._24_8_ = plVar9[3];
    }
    else {
      local_c8._16_8_ = *psVar10;
      local_c8._0_8_ = (size_type *)*plVar9;
    }
    local_c8._8_8_ = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
  }
  else {
    pAVar6 = (((ActivationParams *)puVar11)->NonlinearityType_).linear_;
    uVar7 = ((SliceLayerParams *)puVar11)->endindex_;
    if (((long)uVar7 < 1 || (long)pAVar6 <= (long)uVar7) &&
       (-1 < (long)(uVar7 & (ulong)pAVar6) || (long)pAVar6 <= (long)uVar7)) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_e8,"Slice layer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_c8._0_8_ = local_c8 + 0x10;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar10) {
      local_c8._16_8_ = *psVar10;
      local_c8._24_8_ = plVar9[3];
    }
    else {
      local_c8._16_8_ = *psVar10;
      local_c8._0_8_ = (size_type *)*plVar9;
    }
    local_c8._8_8_ = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Slice", blobNameToRank));
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.slice().axis()) {
            case Specification::SliceLayerParams_SliceAxis_CHANNEL_AXIS:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_HEIGHT_AXIS:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_WIDTH_AXIS:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            default:
                err = "Slice layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Slice layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimension provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    const auto& slice = layer.slice();
    int stride = static_cast<int>(slice.stride());
    if (stride < 1) {
        std::string err = "Stride length for the slice layer '" + layer.name() + "' must be > 1.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    int64_t start = (int64_t)slice.startindex();
    int64_t end = slice.endindex();
    if ((end > 0 && end < start )
        || (end < 0 && start < 0 && start > end)) {
        std::string err = "Slice layer " + layer.name() + " has an end index before the start index.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}